

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

quath tinyusdz::slerp(quath *_a,quath *_b,float t)

{
  half hVar1;
  half hVar2;
  half hVar3;
  half hVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vec<float,_4> vVar12;
  float local_58;
  float fStack_54;
  float fStack_44;
  vec<float,_4> local_38;
  vec<float,_4> local_28;
  
  fVar5 = value::half_to_float((half)(_a->imag)._M_elems[0].value);
  fVar6 = value::half_to_float((half)(_a->imag)._M_elems[1].value);
  fVar7 = value::half_to_float((half)(_a->imag)._M_elems[2].value);
  fVar8 = value::half_to_float((half)(_a->real).value);
  fVar9 = value::half_to_float((half)(_b->imag)._M_elems[0].value);
  fVar10 = value::half_to_float((half)(_b->imag)._M_elems[1].value);
  fVar11 = value::half_to_float((half)(_b->imag)._M_elems[2].value);
  local_38.w = value::half_to_float((half)(_b->real).value);
  local_38.x = fVar9;
  local_38.y = fVar10;
  local_38.z = fVar11;
  local_28.x = fVar5;
  local_28.y = fVar6;
  local_28.z = fVar7;
  local_28.w = fVar8;
  vVar12 = linalg::slerp<float,4>(&local_28,&local_38,t);
  hVar1 = value::float_to_half_full(vVar12.x);
  fStack_44 = vVar12.y;
  hVar2 = value::float_to_half_full(fStack_44);
  local_58 = vVar12.z;
  hVar3 = value::float_to_half_full(local_58);
  fStack_54 = vVar12.w;
  hVar4 = value::float_to_half_full(fStack_54);
  return (quath)((ulong)hVar1.value |
                (ulong)hVar2.value << 0x10 | (ulong)hVar3.value << 0x20 | (ulong)hVar4.value << 0x30
                );
}

Assistant:

value::quath slerp(const value::quath &_a, const value::quath &_b, const float t) {
  value::quatf a;
  value::quatf b;

  a[0] = value::half_to_float(_a[0]);
  a[1] = value::half_to_float(_a[1]);
  a[2] = value::half_to_float(_a[2]);
  a[3] = value::half_to_float(_a[3]);

  b[0] = value::half_to_float(_b[0]);
  b[1] = value::half_to_float(_b[1]);
  b[2] = value::half_to_float(_b[2]);
  b[3] = value::half_to_float(_b[3]);

  value::quatf _c = slerp(a, b, t);

  value::quath c;
  c[0] = value::float_to_half_full(_c[0]);
  c[1] = value::float_to_half_full(_c[1]);
  c[2] = value::float_to_half_full(_c[2]);
  c[3] = value::float_to_half_full(_c[3]);

  return c;
}